

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isxdigit.c
# Opt level: O0

int main(void)

{
  ushort **ppuVar1;
  
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x30] & 0x1000) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x1d,"isxdigit( \'0\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x39] & 0x1000) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x1e,"isxdigit( \'9\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x61] & 0x1000) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x1f,"isxdigit( \'a\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x66] & 0x1000) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x20,"isxdigit( \'f\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x67] & 0x1000) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x21,"! isxdigit( \'g\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x41] & 0x1000) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x22,"isxdigit( \'A\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x46] & 0x1000) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x23,"isxdigit( \'F\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x47] & 0x1000) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x24,"! isxdigit( \'G\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x40] & 0x1000) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x25,"! isxdigit( \'@\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x20] & 0x1000) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x26,"! isxdigit( \' \' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isxdigit( '0' ) );
    TESTCASE( isxdigit( '9' ) );
    TESTCASE( isxdigit( 'a' ) );
    TESTCASE( isxdigit( 'f' ) );
    TESTCASE( ! isxdigit( 'g' ) );
    TESTCASE( isxdigit( 'A' ) );
    TESTCASE( isxdigit( 'F' ) );
    TESTCASE( ! isxdigit( 'G' ) );
    TESTCASE( ! isxdigit( '@' ) );
    TESTCASE( ! isxdigit( ' ' ) );
    return TEST_RESULTS;
}